

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form_test.cpp
# Opt level: O1

void __thiscall unit_test::main(unit_test *this,string *a_case)

{
  long lVar1;
  _Base_ptr p_Var2;
  double dVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  unit_test *this_00;
  byte bVar7;
  char cVar8;
  undefined1 uVar9;
  int iVar10;
  long *plVar11;
  undefined8 *puVar12;
  ostream *poVar13;
  _Rb_tree_node_base *p_Var14;
  ostream *poVar15;
  ostream *poVar16;
  undefined8 uVar17;
  uint uVar18;
  ulong uVar19;
  char *pcVar20;
  bool bVar21;
  form_context context;
  form X;
  submit s;
  form b;
  form a2;
  form a;
  form a1;
  select_multiple select_multiple;
  select select;
  radio radio;
  submit submit;
  password p1;
  numeric<int> integer;
  password p2;
  text text;
  textarea textarea;
  checkbox checkbox;
  file file;
  regex_field regex;
  email email;
  basic_message<char> local_2988;
  form local_2908 [48];
  _Base_ptr *local_28d8;
  char *local_28d0;
  _Base_ptr local_28c8;
  _Base_ptr p_Stack_28c0;
  _Rb_tree_node_base *local_28b8;
  undefined8 local_28b0;
  _Rb_tree_node_base local_28a8;
  _Rb_tree_node_base local_2888;
  _Rb_tree_node_base local_2868 [18];
  unit_test *local_2618;
  ulong *local_2610;
  long local_2608;
  ulong local_2600 [2];
  form local_25f0 [48];
  ulong *local_25c0;
  long local_25b8;
  ulong local_25b0 [2];
  undefined1 *local_25a0 [2];
  undefined1 local_2590 [16];
  undefined1 *local_2580 [2];
  undefined1 local_2570 [16];
  undefined1 *local_2560 [2];
  undefined1 local_2550 [16];
  undefined1 *local_2540 [2];
  undefined1 local_2530 [16];
  undefined1 *local_2520 [2];
  undefined1 local_2510 [16];
  undefined1 *local_2500 [2];
  undefined1 local_24f0 [16];
  undefined1 *local_24e0 [2];
  undefined1 local_24d0 [16];
  undefined1 *local_24c0 [2];
  undefined1 local_24b0 [16];
  undefined1 *local_24a0 [2];
  undefined1 local_2490 [16];
  undefined1 *local_2480 [2];
  undefined1 local_2470 [16];
  undefined1 *local_2460 [2];
  undefined1 local_2450 [16];
  undefined1 *local_2440 [2];
  undefined1 local_2430 [16];
  undefined1 *local_2420 [2];
  undefined1 local_2410 [16];
  undefined1 *local_2400 [2];
  undefined1 local_23f0 [16];
  undefined1 *local_23e0 [2];
  undefined1 local_23d0 [16];
  undefined1 *local_23c0 [2];
  undefined1 local_23b0 [16];
  undefined1 *local_23a0 [2];
  undefined1 local_2390 [16];
  undefined1 *local_2380 [2];
  undefined1 local_2370 [16];
  form local_2360 [48];
  form local_2330 [48];
  form local_2300 [48];
  undefined1 *local_22d0;
  long local_22c8;
  undefined1 local_22c0 [16];
  undefined1 local_22b0 [112];
  undefined8 local_2240;
  select_multiple local_2040 [560];
  select local_1e10 [568];
  radio local_1bd8 [576];
  undefined1 *local_1998 [2];
  undefined1 local_1988 [688];
  long local_16d8 [83];
  undefined1 local_1440 [96];
  undefined8 local_13e0;
  long local_11e0 [83];
  long local_f48 [6];
  undefined1 local_f18 [600];
  long local_cc0 [75];
  long local_a68 [76];
  long local_808 [84];
  long local_568 [83];
  long local_2d0 [84];
  
  cppcms::widgets::text::text((text *)local_f48);
  cppcms::widgets::textarea::textarea((textarea *)local_cc0);
  cppcms::widgets::numeric<int>::numeric((numeric<int> *)local_1440);
  cppcms::widgets::numeric<double>::numeric((numeric<double> *)local_22b0);
  cppcms::widgets::password::password((password *)local_16d8);
  cppcms::widgets::password::password((password *)local_11e0);
  local_1998[0] = local_1988;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1998,"^(yes|no)$","");
  cppcms::widgets::regex_field::regex_field((regex_field *)local_568,(string *)local_1998);
  if (local_1998[0] != local_1988) {
    operator_delete(local_1998[0]);
  }
  cppcms::widgets::email::email((email *)local_2d0);
  cppcms::widgets::checkbox::checkbox((checkbox *)local_a68);
  cppcms::widgets::select_multiple::select_multiple(local_2040);
  cppcms::widgets::select::select(local_1e10);
  cppcms::widgets::radio::radio(local_1bd8);
  cppcms::widgets::submit::submit((submit *)local_1998);
  cppcms::widgets::file::file((file *)local_808);
  lVar1 = *(long *)(local_f48[0] + -0x18);
  local_2380[0] = local_2370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2380,"text","");
  cppcms::widgets::base_widget::message((long)local_f48 + lVar1,local_2380);
  if (local_2380[0] != local_2370) {
    operator_delete(local_2380[0]);
  }
  lVar1 = *(long *)(local_cc0[0] + -0x18);
  local_23a0[0] = local_2390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_23a0,"textarea","");
  cppcms::widgets::base_widget::message((long)local_cc0 + lVar1,local_23a0);
  if (local_23a0[0] != local_2390) {
    operator_delete(local_23a0[0]);
  }
  lVar1 = *(long *)(local_1440._0_8_ + -0x18);
  local_23c0[0] = local_23b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_23c0,"int","");
  cppcms::widgets::base_widget::message(local_1440 + lVar1,local_23c0);
  if (local_23c0[0] != local_23b0) {
    operator_delete(local_23c0[0]);
  }
  lVar1 = *(long *)(local_22b0._0_8_ + -0x18);
  local_23e0[0] = local_23d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_23e0,"double","");
  cppcms::widgets::base_widget::message(local_22b0 + lVar1,local_23e0);
  if (local_23e0[0] != local_23d0) {
    operator_delete(local_23e0[0]);
  }
  lVar1 = *(long *)(local_16d8[0] + -0x18);
  local_2400[0] = local_23f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2400,"pass","");
  cppcms::widgets::base_widget::message((long)local_16d8 + lVar1,local_2400);
  if (local_2400[0] != local_23f0) {
    operator_delete(local_2400[0]);
  }
  lVar1 = *(long *)(local_11e0[0] + -0x18);
  local_2420[0] = local_2410;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2420,"pass2","");
  cppcms::widgets::base_widget::message((long)local_11e0 + lVar1,local_2420);
  if (local_2420[0] != local_2410) {
    operator_delete(local_2420[0]);
  }
  lVar1 = *(long *)(local_568[0] + -0x18);
  local_2440[0] = local_2430;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2440,"yes or not","");
  cppcms::widgets::base_widget::message((long)local_568 + lVar1,local_2440);
  if (local_2440[0] != local_2430) {
    operator_delete(local_2440[0]);
  }
  lVar1 = *(long *)(local_2d0[0] + -0x18);
  local_2460[0] = local_2450;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2460,"E-Mail","");
  cppcms::widgets::base_widget::message((long)local_2d0 + lVar1,local_2460);
  if (local_2460[0] != local_2450) {
    operator_delete(local_2460[0]);
  }
  lVar1 = *(long *)(local_a68[0] + -0x18);
  local_2480[0] = local_2470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2480,"Checkbox","");
  cppcms::widgets::base_widget::message((long)local_a68 + lVar1,local_2480);
  if (local_2480[0] != local_2470) {
    operator_delete(local_2480[0]);
  }
  local_24a0[0] = local_2490;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_24a0,"Select Multiple","");
  cppcms::widgets::base_widget::message(local_2040,local_24a0);
  if (local_24a0[0] != local_2490) {
    operator_delete(local_24a0[0]);
  }
  local_24c0[0] = local_24b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_24c0,"Select","");
  cppcms::widgets::base_widget::message(local_1e10,local_24c0);
  if (local_24c0[0] != local_24b0) {
    operator_delete(local_24c0[0]);
  }
  local_24e0[0] = local_24d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_24e0,"Radio","");
  cppcms::widgets::base_widget::message(local_1bd8,local_24e0);
  if (local_24e0[0] != local_24d0) {
    operator_delete(local_24e0[0]);
  }
  lVar1 = *(long *)(local_1998[0] + -0x18);
  local_2500[0] = local_24f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2500,"Submit","");
  cppcms::widgets::base_widget::message((long)local_1998 + lVar1,local_2500);
  if (local_2500[0] != local_24f0) {
    operator_delete(local_2500[0]);
  }
  local_2520[0] = local_2510;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2520,"Button","");
  cppcms::widgets::submit::value(local_1998,local_2520);
  if (local_2520[0] != local_2510) {
    operator_delete(local_2520[0]);
  }
  local_28d8 = &local_28c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_28d8,"a","");
  cppcms::widgets::select_multiple::add((string *)local_2040,SUB81(&local_28d8,0));
  if (local_28d8 != &local_28c8) {
    operator_delete(local_28d8);
  }
  local_28d8 = &local_28c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_28d8,"b","");
  cppcms::widgets::select_multiple::add((string *)local_2040,SUB81(&local_28d8,0));
  if (local_28d8 != &local_28c8) {
    operator_delete(local_28d8);
  }
  local_28d8 = &local_28c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_28d8,"c","");
  cppcms::widgets::select_multiple::add((string *)local_2040,SUB81(&local_28d8,0));
  local_2618 = this;
  if (local_28d8 != &local_28c8) {
    operator_delete(local_28d8);
  }
  local_28d8 = (_Base_ptr *)((ulong)local_28d8 & 0xffffffff00000000);
  local_28d0 = "tr1";
  local_28c8 = (_Base_ptr)0x0;
  p_Stack_28c0 = (_Base_ptr)0x0;
  local_28b0 = 0;
  local_28a8._M_color._0_1_ = _S_red;
  local_28a8._M_right = (_Base_ptr)0x0;
  local_2888._M_color._0_1_ = _S_red;
  local_2888._M_right = (_Base_ptr)0x0;
  local_2868[0]._M_color._0_1_ = _S_red;
  local_2988._0_8_ = (long)&local_2988 + 0x10;
  local_28b8 = &local_28a8;
  local_28a8._M_left = &local_2888;
  local_2888._M_left = local_2868;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2988,"id1","");
  cppcms::widgets::select_multiple::add
            ((basic_message *)local_2040,(string *)&local_28d8,SUB81(&local_2988,0));
  if ((void *)local_2988._0_8_ != (void *)((long)&local_2988 + 0x10U)) {
    operator_delete((void *)local_2988._0_8_);
  }
  if (local_2888._M_left != local_2868) {
    operator_delete(local_2888._M_left);
  }
  if (local_28a8._M_left != &local_2888) {
    operator_delete(local_28a8._M_left);
  }
  if (local_28b8 != &local_28a8) {
    operator_delete(local_28b8);
  }
  local_28d8 = &local_28c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_28d8,"a","");
  cppcms::widgets::select_base::add((string *)local_1e10);
  if (local_28d8 != &local_28c8) {
    operator_delete(local_28d8);
  }
  local_28d8 = &local_28c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_28d8,"b","");
  cppcms::widgets::select_base::add((string *)local_1e10);
  if (local_28d8 != &local_28c8) {
    operator_delete(local_28d8);
  }
  local_28d8 = &local_28c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_28d8,"c","");
  cppcms::widgets::select_base::add((string *)local_1e10);
  if (local_28d8 != &local_28c8) {
    operator_delete(local_28d8);
  }
  local_28d8 = (_Base_ptr *)((ulong)local_28d8 & 0xffffffff00000000);
  local_28d0 = "tr2";
  local_28c8 = (_Base_ptr)0x0;
  p_Stack_28c0 = (_Base_ptr)0x0;
  local_28b0 = 0;
  local_28a8._M_color._0_1_ = _S_red;
  local_28a8._M_right = (_Base_ptr)0x0;
  local_2888._M_color._0_1_ = _S_red;
  local_2888._M_right = (_Base_ptr)0x0;
  local_2868[0]._M_color._0_1_ = _S_red;
  local_2988._0_8_ = (long)&local_2988 + 0x10;
  local_28b8 = &local_28a8;
  local_28a8._M_left = &local_2888;
  local_2888._M_left = local_2868;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2988,"id2","");
  cppcms::widgets::select_base::add((basic_message *)local_1e10,(string *)&local_28d8);
  if ((void *)local_2988._0_8_ != (void *)((long)&local_2988 + 0x10U)) {
    operator_delete((void *)local_2988._0_8_);
  }
  if (local_2888._M_left != local_2868) {
    operator_delete(local_2888._M_left);
  }
  if (local_28a8._M_left != &local_2888) {
    operator_delete(local_28a8._M_left);
  }
  if (local_28b8 != &local_28a8) {
    operator_delete(local_28b8);
  }
  local_2540[0] = local_2530;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2540,"id2","");
  cppcms::widgets::select_base::selected_id(local_1e10,local_2540);
  if (local_2540[0] != local_2530) {
    operator_delete(local_2540[0]);
  }
  local_28d8 = &local_28c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_28d8,"x","");
  cppcms::widgets::select_base::add((string *)local_1bd8);
  if (local_28d8 != &local_28c8) {
    operator_delete(local_28d8);
  }
  local_28d8 = &local_28c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_28d8,"y","");
  cppcms::widgets::select_base::add((string *)local_1bd8);
  if (local_28d8 != &local_28c8) {
    operator_delete(local_28d8);
  }
  local_28d8 = (_Base_ptr *)((ulong)local_28d8 & 0xffffffff00000000);
  local_28d0 = "tr3";
  local_28c8 = (_Base_ptr)0x0;
  p_Stack_28c0 = (_Rb_tree_node_base *)0x0;
  local_28b0 = 0;
  local_28a8._M_color._0_1_ = _S_red;
  local_28a8._M_right = (_Base_ptr)0x0;
  local_2888._M_color._0_1_ = _S_red;
  local_2888._M_right = (_Base_ptr)0x0;
  local_2868[0]._M_color._0_1_ = _S_red;
  local_2988._0_8_ = (long)&local_2988 + 0x10;
  local_28b8 = &local_28a8;
  local_28a8._M_left = &local_2888;
  local_2888._M_left = local_2868;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2988,"id3","");
  cppcms::widgets::select_base::add((basic_message *)local_1bd8,(string *)&local_28d8);
  if ((long *)local_2988._0_8_ != (long *)((long)&local_2988 + 0x10U)) {
    operator_delete((void *)local_2988._0_8_);
  }
  if (local_2888._M_left != local_2868) {
    operator_delete(local_2888._M_left);
  }
  this_00 = local_2618;
  if (local_28a8._M_left != &local_2888) {
    operator_delete(local_28a8._M_left);
  }
  if (local_28b8 != &local_28a8) {
    operator_delete(local_28b8);
  }
  cppcms::widgets::select_base::selected((int)local_1bd8);
  cppcms::form::form(local_2908);
  cppcms::form::form(local_2330);
  cppcms::form::form(local_2300);
  cppcms::form::form(local_2360);
  cppcms::form::form(local_25f0);
  if (((a_case->_M_string_length != 0) &&
      (iVar10 = std::__cxx11::string::compare((char *)a_case), iVar10 != 0)) &&
     (iVar10 = std::__cxx11::string::compare((char *)a_case), iVar10 != 0)) {
    iVar10 = std::__cxx11::string::compare((char *)a_case);
    if (iVar10 == 0) {
      cppcms::form::add((base_widget *)local_2908);
      cppcms::widgets::base_text::limits((int)local_f18,2);
      load(this_00,local_2908);
      cVar8 = cppcms::widgets::base_widget::set();
      if (cVar8 == '\0') goto LAB_0010bb46;
      cppcms::application::response();
      poVar16 = (ostream *)cppcms::http::response::out();
      cppcms::widgets::base_text::value_abi_cxx11_();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,(char *)local_28d8,(long)local_28d0);
      goto LAB_0010ba3f;
    }
    iVar10 = std::__cxx11::string::compare((char *)a_case);
    if (iVar10 == 0) {
      cppcms::form::add((base_widget *)local_2908);
      local_22b0[0x48] = true;
      local_22b0[0x49] = true;
      local_22b0[0x4a] = true;
      local_22b0._48_8_ = 5.0;
      local_22b0._56_8_ = 100.0;
      load(this_00,local_2908);
      cVar8 = cppcms::widgets::base_widget::set();
      if (cVar8 != '\0') {
        cppcms::application::response();
        cppcms::http::response::out();
        dVar3 = cppcms::widgets::numeric<double>::value((numeric<double> *)local_22b0);
        std::ostream::_M_insert<double>(dVar3);
      }
      goto LAB_0010bb46;
    }
    iVar10 = std::__cxx11::string::compare((char *)a_case);
    if (iVar10 == 0) {
      cppcms::form::add((base_widget *)local_2908);
      cppcms::form::add((base_widget *)local_2908);
      cppcms::widgets::base_text::non_empty();
      cppcms::widgets::password::check_equal((password *)local_11e0);
LAB_0010bdda:
      load(this_00,local_2908);
      goto LAB_0010bb46;
    }
    iVar10 = std::__cxx11::string::compare((char *)a_case);
    if (iVar10 == 0) {
      cppcms::form::add((base_widget *)local_2908);
      load(this_00,local_2908);
      cppcms::application::response();
      uVar9 = cppcms::http::response::out();
      cppcms::widgets::checkbox::value();
LAB_0010be3b:
      std::ostream::_M_insert<bool>((bool)uVar9);
    }
    else {
      iVar10 = std::__cxx11::string::compare((char *)a_case);
      if (iVar10 == 0) {
        cppcms::form::add((base_widget *)local_2908);
        cppcms::widgets::select_multiple::non_empty();
        cppcms::widgets::select_multiple::at_most((uint)local_2040);
        load(this_00,local_2908);
        cppcms::application::response();
        poVar16 = (ostream *)cppcms::http::response::out();
        cppcms::widgets::select_multiple::selected_map();
        if (((long)local_2988.c_context_ - local_2988._0_8_) * 8 +
            ((ulong)local_2988.c_plural_ & 0xffffffff) != 0) {
          uVar19 = 1;
          do {
            poVar13 = std::ostream::_M_insert<bool>(SUB81(poVar16,0));
            std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            bVar21 = uVar19 < ((ulong)local_2988.c_plural_ & 0xffffffff) +
                              ((long)local_2988.c_context_ - local_2988._0_8_) * 8;
            uVar19 = (ulong)((int)uVar19 + 1);
          } while (bVar21);
        }
        std::endl<char,std::char_traits<char>>(poVar16);
        cppcms::widgets::select_multiple::selected_ids_abi_cxx11_();
        for (p_Var14 = p_Stack_28c0; p_Var14 != (_Rb_tree_node_base *)&local_28d0;
            p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar16,*(char **)(p_Var14 + 1),(long)p_Var14[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
        }
        std::endl<char,std::char_traits<char>>(poVar16);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_28d8);
        if ((long *)local_2988._0_8_ != (long *)0x0) {
          operator_delete((void *)local_2988._0_8_);
          local_2988._0_8_ = (long *)0x0;
          local_2988.c_id_ = (char_type *)((ulong)local_2988.c_id_ & 0xffffffff00000000);
          local_2988.c_context_ = (char_type *)0x0;
          local_2988.c_plural_ = (char_type *)((ulong)local_2988.c_plural_ & 0xffffffff00000000);
          local_2988.id_._M_dataplus._M_p = (pointer)0x0;
        }
        goto LAB_0010bb46;
      }
      iVar10 = std::__cxx11::string::compare((char *)a_case);
      if (iVar10 == 0) {
        cppcms::form::add((base_widget *)local_2908);
        cppcms::widgets::select_base::non_empty();
        load(this_00,local_2908);
        cppcms::application::response();
        poVar15 = (ostream *)cppcms::http::response::out();
        iVar10 = cppcms::widgets::select_base::selected();
        poVar16 = (ostream *)std::ostream::operator<<(poVar15,iVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
        cppcms::widgets::select_base::selected_id_abi_cxx11_();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,(char *)local_28d8,(long)local_28d0);
      }
      else {
        iVar10 = std::__cxx11::string::compare((char *)a_case);
        if (iVar10 != 0) {
          iVar10 = std::__cxx11::string::compare((char *)a_case);
          if (iVar10 != 0) {
            iVar10 = std::__cxx11::string::compare((char *)a_case);
            if (iVar10 == 0) {
              cppcms::widgets::submit::submit((submit *)&local_28d8);
              p_Var2 = local_28d8[-3];
              local_2560[0] = local_2550;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_2560,"submit_id","");
              cppcms::widgets::base_widget::id((long)&local_28d8 + (long)p_Var2,local_2560);
              if (local_2560[0] != local_2550) {
                operator_delete(local_2560[0]);
              }
              p_Var2 = local_28d8[-3];
              local_2580[0] = local_2570;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_2580,"submit_name","")
              ;
              cppcms::widgets::base_widget::name((long)&local_28d8 + (long)p_Var2,local_2580);
              if (local_2580[0] != local_2570) {
                operator_delete(local_2580[0]);
              }
              paVar4 = &local_2988.id_.field_2;
              local_2988._0_8_ = local_2988._0_8_ & 0xffffffff00000000;
              local_2988.c_id_ = "help";
              local_2988.c_context_ = (char_type *)0x0;
              local_2988.c_plural_ = (char_type *)0x0;
              local_2988.id_._M_string_length = 0;
              local_2988.id_.field_2._M_local_buf[0] = '\0';
              paVar5 = &local_2988.context_.field_2;
              local_2988.context_._M_string_length = 0;
              local_2988.context_.field_2._M_local_buf[0] = '\0';
              paVar6 = &local_2988.plural_.field_2;
              local_2988.plural_._M_string_length = 0;
              local_2988.plural_.field_2._M_local_buf[0] = '\0';
              local_2988.id_._M_dataplus._M_p = (pointer)paVar4;
              local_2988.context_._M_dataplus._M_p = (pointer)paVar5;
              local_2988.plural_._M_dataplus._M_p = (pointer)paVar6;
              cppcms::widgets::base_widget::help
                        ((basic_message *)((submit *)&local_28d8 + (long)local_28d8[-3]));
              booster::locale::basic_message<char>::~basic_message(&local_2988);
              local_2988._0_8_ = local_2988._0_8_ & 0xffffffff00000000;
              local_2988.c_id_ = "error";
              local_2988.c_context_ = (char_type *)0x0;
              local_2988.c_plural_ = (char_type *)0x0;
              local_2988.id_._M_string_length = 0;
              local_2988.id_.field_2._M_local_buf[0] = '\0';
              local_2988.context_._M_string_length = 0;
              local_2988.context_.field_2._M_local_buf[0] = '\0';
              local_2988.plural_._M_string_length = 0;
              local_2988.plural_.field_2._M_local_buf[0] = '\0';
              local_2988.id_._M_dataplus._M_p = (pointer)paVar4;
              local_2988.context_._M_dataplus._M_p = (pointer)paVar5;
              local_2988.plural_._M_dataplus._M_p = (pointer)paVar6;
              cppcms::widgets::base_widget::error_message
                        ((basic_message *)((submit *)&local_28d8 + (long)local_28d8[-3]));
              booster::locale::basic_message<char>::~basic_message(&local_2988);
              local_2988._0_8_ = local_2988._0_8_ & 0xffffffff00000000;
              local_2988.c_id_ = "message";
              local_2988.c_context_ = (char_type *)0x0;
              local_2988.c_plural_ = (char_type *)0x0;
              local_2988.id_._M_string_length = 0;
              local_2988.id_.field_2._M_local_buf[0] = '\0';
              local_2988.context_._M_string_length = 0;
              local_2988.context_.field_2._M_local_buf[0] = '\0';
              local_2988.plural_._M_string_length = 0;
              local_2988.plural_.field_2._M_local_buf[0] = '\0';
              local_2988.id_._M_dataplus._M_p = (pointer)paVar4;
              local_2988.context_._M_dataplus._M_p = (pointer)paVar5;
              local_2988.plural_._M_dataplus._M_p = (pointer)paVar6;
              cppcms::widgets::base_widget::message
                        ((basic_message *)((submit *)&local_28d8 + (long)local_28d8[-3]));
              booster::locale::basic_message<char>::~basic_message(&local_2988);
              cppcms::widgets::base_widget::valid
                        ((bool)((char)(submit *)&local_28d8 + (char)local_28d8[-3]));
              local_2988._0_8_ = local_2988._0_8_ & 0xffffffff00000000;
              local_2988.c_id_ = "test";
              local_2988.c_context_ = (char_type *)0x0;
              local_2988.c_plural_ = (char_type *)0x0;
              local_2988.id_._M_string_length = 0;
              local_2988.id_.field_2._M_local_buf[0] = '\0';
              local_2988.context_._M_string_length = 0;
              local_2988.context_.field_2._M_local_buf[0] = '\0';
              local_2988.plural_._M_string_length = 0;
              local_2988.plural_.field_2._M_local_buf[0] = '\0';
              local_2988.id_._M_dataplus._M_p = (pointer)paVar4;
              local_2988.context_._M_dataplus._M_p = (pointer)paVar5;
              local_2988.plural_._M_dataplus._M_p = (pointer)paVar6;
              cppcms::widgets::submit::value((basic_message *)&local_28d8);
              booster::locale::basic_message<char>::~basic_message(&local_2988);
              cppcms::form::add((base_widget *)local_2908);
              cppcms::application::response();
              uVar17 = cppcms::http::response::out();
              cppcms::form_context::form_context((form_context *)&local_2988,uVar17,0,0);
              cppcms::form::render((form_context *)local_2908);
              cppcms::form_context::~form_context((form_context *)&local_2988);
              cppcms::widgets::submit::~submit((submit *)&local_28d8);
              goto LAB_0010bb46;
            }
            iVar10 = std::__cxx11::string::compare((char *)a_case);
            if ((iVar10 != 0) &&
               (iVar10 = std::__cxx11::string::compare((char *)a_case), iVar10 != 0))
            goto LAB_0010bb46;
            cppcms::widgets::file::non_empty();
            lVar1 = *(long *)(local_808[0] + -0x18);
            local_25a0[0] = local_2590;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_25a0,"file","");
            cppcms::widgets::base_widget::name((long)local_808 + lVar1);
            if (local_25a0[0] != local_2590) {
              operator_delete(local_25a0[0]);
            }
            cppcms::widgets::file::limits((int)local_808,0);
            iVar10 = std::__cxx11::string::compare((char *)a_case);
            if (iVar10 == 0) {
              local_28d8 = &local_28c8;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_28d8,"text/plain","")
              ;
              cppcms::widgets::file::mime((string *)local_808);
            }
            else {
              local_28d8 = &local_28c8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_28d8,"^text/(html|plain)$","");
              booster::regex::regex((regex *)&local_2988,(string *)&local_28d8,0);
              cppcms::widgets::file::mime((regex *)local_808);
              booster::regex::~regex((regex *)&local_2988);
            }
            if (local_28d8 != &local_28c8) {
              operator_delete(local_28d8);
            }
            local_28d8 = &local_28c8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_28d8,"foo","");
            cppcms::widgets::file::add_valid_magic((string *)local_808);
            if (local_28d8 != &local_28c8) {
              operator_delete(local_28d8);
            }
            local_28d8 = &local_28c8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_28d8,"P3","");
            cppcms::widgets::file::add_valid_magic((string *)local_808);
            if (local_28d8 != &local_28c8) {
              operator_delete(local_28d8);
            }
            cppcms::form::add((base_widget *)local_2908);
            goto LAB_0010bdda;
          }
          cppcms::form::add((base_widget *)local_2908);
          load(this_00,local_2908);
          cppcms::application::response();
          uVar9 = cppcms::http::response::out();
          cppcms::widgets::submit::value();
          goto LAB_0010be3b;
        }
        cppcms::form::add((base_widget *)local_2908);
        cppcms::widgets::select_base::non_empty();
        load(this_00,local_2908);
        cppcms::application::response();
        poVar15 = (ostream *)cppcms::http::response::out();
        iVar10 = cppcms::widgets::select_base::selected();
        poVar16 = (ostream *)std::ostream::operator<<(poVar15,iVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
        cppcms::widgets::select_base::selected_id_abi_cxx11_();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,(char *)local_28d8,(long)local_28d0);
      }
LAB_0010ba3f:
      if (local_28d8 != &local_28c8) {
        operator_delete(local_28d8);
      }
    }
    goto LAB_0010bb46;
  }
  cppcms::form::add((base_widget *)local_2908);
  cppcms::form::add(local_2908);
  cppcms::form::add(local_2908);
  cppcms::form::add(local_2330);
  cppcms::form::add(local_2330);
  cppcms::form::add((base_widget *)local_2300);
  cppcms::form::add((base_widget *)local_2360);
  cppcms::form::add((base_widget *)local_2360);
  cppcms::form::add((base_widget *)local_25f0);
  cppcms::form::add((base_widget *)local_25f0);
  cppcms::form::add((base_widget *)local_25f0);
  cppcms::form::add((base_widget *)local_25f0);
  cppcms::form::add((base_widget *)local_25f0);
  cppcms::form::add((base_widget *)local_25f0);
  cppcms::form::add((base_widget *)local_2908);
  cppcms::form::add((base_widget *)local_2908);
  cppcms::form::add((base_widget *)local_2908);
  if (a_case->_M_string_length != 0) {
    cppcms::widgets::base_text::non_empty();
    cppcms::widgets::base_text::non_empty();
    local_1440[0x3e] = true;
    local_22b0[0x4a] = true;
    cppcms::widgets::base_text::non_empty();
    cppcms::widgets::base_text::non_empty();
    cppcms::widgets::base_text::non_empty();
    cppcms::widgets::base_text::non_empty();
    cppcms::widgets::select_multiple::non_empty();
    cppcms::widgets::select_base::non_empty();
    cppcms::widgets::select_base::non_empty();
  }
  cppcms::application::request();
  cppcms::http::request::request_method_abi_cxx11_((request *)&local_28d8);
  iVar10 = std::__cxx11::string::compare((char *)&local_28d8);
  if (iVar10 == 0) {
    bVar21 = true;
  }
  else {
    cppcms::application::request();
    cppcms::http::request::query_string_abi_cxx11_();
    bVar21 = local_22c8 != 0;
    if (local_22d0 != local_22c0) {
      operator_delete(local_22d0);
    }
  }
  if (local_28d8 != &local_28c8) {
    operator_delete(local_28d8);
  }
  if (bVar21) {
    cppcms::application::response();
    cppcms::http::response::set_plain_text_header();
    cppcms::application::response();
    poVar16 = (ostream *)cppcms::http::response::out();
    cppcms::application::context();
    cppcms::form::load((context *)local_2908);
    bVar7 = cppcms::form::validate();
    pcVar20 = "invalid";
    if (bVar7 != 0) {
      pcVar20 = "valid";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar20,(ulong)(bVar7 ^ 1) * 2 + 5);
    bVar21 = SUB81(poVar16,0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + bVar21);
    std::ostream::put(bVar21);
    std::ostream::flush();
    cVar8 = cppcms::widgets::base_widget::set();
    if (cVar8 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"Text:",5);
      cppcms::widgets::base_text::value_abi_cxx11_();
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)local_28d8,(long)local_28d0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      if (local_28d8 != &local_28c8) {
        operator_delete(local_28d8);
      }
    }
    cVar8 = cppcms::widgets::base_widget::set();
    if (cVar8 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"Textarea:",9);
      cppcms::widgets::base_text::value_abi_cxx11_();
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)local_28d8,(long)local_28d0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      if (local_28d8 != &local_28c8) {
        operator_delete(local_28d8);
      }
    }
    cVar8 = cppcms::widgets::base_widget::set();
    if (cVar8 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"Int:",4);
      iVar10 = cppcms::widgets::numeric<int>::value((numeric<int> *)local_1440);
      plVar11 = (long *)std::ostream::operator<<((ostream *)poVar16,iVar10);
      std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
      std::ostream::put((char)plVar11);
      std::ostream::flush();
    }
    cVar8 = cppcms::widgets::base_widget::set();
    if (cVar8 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"Double:",7);
      dVar3 = cppcms::widgets::numeric<double>::value((numeric<double> *)local_22b0);
      poVar13 = std::ostream::_M_insert<double>(dVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
    }
    cVar8 = cppcms::widgets::base_widget::set();
    if (cVar8 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"p1:",3);
      cppcms::widgets::base_text::value_abi_cxx11_();
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)local_28d8,(long)local_28d0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      if (local_28d8 != &local_28c8) {
        operator_delete(local_28d8);
      }
    }
    cVar8 = cppcms::widgets::base_widget::set();
    if (cVar8 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"p2:",3);
      cppcms::widgets::base_text::value_abi_cxx11_();
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)local_28d8,(long)local_28d0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      if (local_28d8 != &local_28c8) {
        operator_delete(local_28d8);
      }
    }
    cVar8 = cppcms::widgets::base_widget::set();
    if (cVar8 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"regex: ",7);
      cppcms::widgets::base_text::value_abi_cxx11_();
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)local_28d8,(long)local_28d0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      if (local_28d8 != &local_28c8) {
        operator_delete(local_28d8);
      }
    }
    cVar8 = cppcms::widgets::base_widget::set();
    if (cVar8 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"email: ",7);
      cppcms::widgets::base_text::value_abi_cxx11_();
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)local_28d8,(long)local_28d0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      if (local_28d8 != &local_28c8) {
        operator_delete(local_28d8);
      }
    }
    cVar8 = cppcms::widgets::base_widget::set();
    if (cVar8 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"checkbox: ",10);
      cppcms::widgets::checkbox::value();
      poVar13 = std::ostream::_M_insert<bool>(bVar21);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
    }
    cVar8 = cppcms::widgets::base_widget::set();
    if (cVar8 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"selected m:",0xb);
      cppcms::widgets::select_multiple::selected_map();
      if (((long)local_2988.c_context_ - local_2988._0_8_) * 8 +
          ((ulong)local_2988.c_plural_ & 0xffffffff) != 0) {
        uVar18 = 1;
        do {
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
          uVar19 = (ulong)uVar18;
          uVar18 = uVar18 + 1;
        } while (uVar19 < ((ulong)local_2988.c_plural_ & 0xffffffff) +
                          ((long)local_2988.c_context_ - local_2988._0_8_) * 8);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + bVar21);
      std::ostream::put(bVar21);
      std::ostream::flush();
      cppcms::widgets::select_multiple::selected_ids_abi_cxx11_();
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"selected m ids:",0xf);
      for (p_Var14 = p_Stack_28c0; p_Var14 != (_Rb_tree_node_base *)&local_28d0;
          p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,*(char **)(p_Var14 + 1),(long)p_Var14[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + bVar21);
      std::ostream::put(bVar21);
      std::ostream::flush();
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_28d8);
      if ((long *)local_2988._0_8_ != (long *)0x0) {
        operator_delete((void *)local_2988._0_8_);
        local_2988._0_8_ = (long *)0x0;
        local_2988.c_id_ = (char_type *)((ulong)local_2988.c_id_ & 0xffffffff00000000);
        local_2988.c_context_ = (char_type *)0x0;
        local_2988.c_plural_ = (char_type *)((ulong)local_2988.c_plural_ & 0xffffffff00000000);
        local_2988.id_._M_dataplus._M_p = (pointer)0x0;
      }
    }
    cVar8 = cppcms::widgets::base_widget::set();
    if (cVar8 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"Select: selected ",0x11);
      iVar10 = cppcms::widgets::select_base::selected();
      poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar16,iVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," id=",4);
      cppcms::widgets::select_base::selected_id_abi_cxx11_();
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,(char *)local_28d8,(long)local_28d0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      if (local_28d8 != &local_28c8) {
        operator_delete(local_28d8);
      }
    }
    cVar8 = cppcms::widgets::base_widget::set();
    if (cVar8 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"Radio: selected ",0x10);
      iVar10 = cppcms::widgets::select_base::selected();
      poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar16,iVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," id=",4);
      cppcms::widgets::select_base::selected_id_abi_cxx11_();
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,(char *)local_28d8,(long)local_28d0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      if (local_28d8 != &local_28c8) {
        operator_delete(local_28d8);
      }
    }
    cVar8 = cppcms::widgets::base_widget::set();
    if (cVar8 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"Submit pressed: ",0x10);
      cppcms::widgets::submit::value();
      poVar16 = std::ostream::_M_insert<bool>(bVar21);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      std::ostream::put((char)poVar16);
      std::ostream::flush();
    }
    goto LAB_0010bb46;
  }
  iVar10 = std::__cxx11::string::compare((char *)a_case);
  if (iVar10 == 0) {
    cppcms::application::response();
    uVar17 = cppcms::http::response::out();
    cppcms::form_context::form_context((form_context *)&local_28d8,uVar17,0,0);
    cppcms::form::render((form_context *)local_25f0);
  }
  else {
    cppcms::application::response();
    poVar16 = (ostream *)cppcms::http::response::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"non loaded<br>\n",0xf);
    cppcms::form_context::form_context((form_context *)&local_28d8,poVar16,0,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"<form action=\"",0xe);
    cppcms::application::request();
    cppcms::http::request::script_name_abi_cxx11_();
    cppcms::application::request();
    cppcms::http::request::path_info_abi_cxx11_();
    uVar19 = 0xf;
    if (local_25c0 != local_25b0) {
      uVar19 = local_25b0[0];
    }
    if (uVar19 < (ulong)(local_2608 + local_25b8)) {
      uVar19 = 0xf;
      if (local_2610 != local_2600) {
        uVar19 = local_2600[0];
      }
      if (uVar19 < (ulong)(local_2608 + local_25b8)) goto LAB_0010b94a;
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_2610,0,(char *)0x0,(ulong)local_25c0);
    }
    else {
LAB_0010b94a:
      puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_25c0,(ulong)local_2610)
      ;
    }
    plVar11 = puVar12 + 2;
    if ((long *)*puVar12 == plVar11) {
      local_2988.c_context_ = (char_type *)*plVar11;
      local_2988.c_plural_ = (char_type *)puVar12[3];
      local_2988._0_8_ = (long *)((long)&local_2988 + 0x10U);
    }
    else {
      local_2988.c_context_ = (char_type *)*plVar11;
      local_2988._0_8_ = (long *)*puVar12;
    }
    local_2988.c_id_ = (char_type *)puVar12[1];
    *puVar12 = plVar11;
    puVar12[1] = 0;
    *(char *)plVar11 = '\0';
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16,(char *)local_2988._0_8_,(long)local_2988.c_id_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\" method=\"post\" >\n",0x12);
    if ((long *)local_2988._0_8_ != (long *)((long)&local_2988 + 0x10U)) {
      operator_delete((void *)local_2988._0_8_);
    }
    if (local_2610 != local_2600) {
      operator_delete(local_2610);
    }
    if (local_25c0 != local_25b0) {
      operator_delete(local_25c0);
    }
    cppcms::form::render((form_context *)local_2908);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"</form>\n",8);
  }
  cppcms::form_context::~form_context((form_context *)&local_28d8);
LAB_0010bb46:
  cppcms::form::~form(local_25f0);
  cppcms::form::~form(local_2360);
  cppcms::form::~form(local_2300);
  cppcms::form::~form(local_2330);
  cppcms::form::~form(local_2908);
  cppcms::widgets::file::~file((file *)local_808);
  cppcms::widgets::submit::~submit((submit *)local_1998);
  cppcms::widgets::radio::~radio(local_1bd8);
  cppcms::widgets::select::~select(local_1e10);
  cppcms::widgets::select_multiple::~select_multiple(local_2040);
  cppcms::widgets::checkbox::~checkbox((checkbox *)local_a68);
  cppcms::widgets::email::~email((email *)local_2d0);
  cppcms::widgets::regex_field::~regex_field((regex_field *)local_568);
  cppcms::widgets::password::~password((password *)local_11e0);
  cppcms::widgets::password::~password((password *)local_16d8);
  local_22b0._0_8_ = 0x112900;
  local_2240 = 0x112990;
  if ((undefined1 *)local_22b0._80_8_ != local_22b0 + 0x60) {
    operator_delete((void *)local_22b0._80_8_);
  }
  cppcms::widgets::base_html_input::~base_html_input((base_html_input *)local_22b0);
  cppcms::widgets::base_widget::~base_widget((base_widget *)&local_2240);
  local_1440._0_8_ = 0x1126f0;
  local_13e0 = 0x112780;
  if ((undefined1 *)local_1440._64_8_ != local_1440 + 0x50) {
    operator_delete((void *)local_1440._64_8_);
  }
  cppcms::widgets::base_html_input::~base_html_input((base_html_input *)local_1440);
  cppcms::widgets::base_widget::~base_widget((base_widget *)&local_13e0);
  cppcms::widgets::textarea::~textarea((textarea *)local_cc0);
  cppcms::widgets::text::~text((text *)local_f48);
  return;
}

Assistant:

virtual void main(std::string a_case)
	{
		cppcms::widgets::text text;
		cppcms::widgets::textarea textarea;
		cppcms::widgets::numeric<int> integer;
		cppcms::widgets::numeric<double> real;
		cppcms::widgets::password p1,p2;
		cppcms::widgets::regex_field regex("^(yes|no)$");
		cppcms::widgets::email email;
		cppcms::widgets::checkbox checkbox;
		cppcms::widgets::select_multiple select_multiple;
		cppcms::widgets::select select;
		cppcms::widgets::radio radio;
		cppcms::widgets::submit submit;
		cppcms::widgets::file file;


		text.message("text");
		textarea.message("textarea");
		integer.message("int");
		real.message("double");
		p1.message("pass");
		p2.message("pass2");
		regex.message("yes or not");
		email.message("E-Mail");
		checkbox.message("Checkbox");
		select_multiple.message("Select Multiple");
		select.message("Select");
		radio.message("Radio");
		submit.message("Submit");
		submit.value("Button");

		select_multiple.add("a",true);
		select_multiple.add("b",true);
		select_multiple.add("c");
		select_multiple.add(cppcms::locale::translate("tr1"),std::string("id1"));

		select.add("a");
		select.add("b");
		select.add("c");
		select.add(cppcms::locale::translate("tr2"),"id2");
		select.selected_id("id2");

		radio.add("x");
		radio.add("y");
		radio.add(cppcms::locale::translate("tr3"),"id3");
		radio.selected(0);

		cppcms::form X,a,a1,a2,b;

		if(a_case.empty() || a_case == "/non_empty" || a_case=="/sub"){
			X.add(text);
			X.add(a);
			X.add(b);
			a.add(a1);
			a.add(a2);
			a1.add(textarea);
			a2.add(integer);
			a2.add(real);
			b.add(p1);
			b.add(p2);
			b.add(regex);
			b.add(email);
			b.add(checkbox);
			b.add(select_multiple);
			X.add(select);
			X.add(radio);
			X.add(submit);

			if(!a_case.empty()) {
				text.non_empty();
				textarea.non_empty();
				integer.non_empty();
				real.non_empty();
				p1.non_empty();
				p2.non_empty();
				regex.non_empty();
				email.non_empty();
				select_multiple.non_empty();
				select.non_empty();
				radio.non_empty();
			}

			if(request().request_method()=="POST" || !request().query_string().empty()) {
				response().set_plain_text_header();
				std::ostream &out = response().out();
				X.load(context());
				if(X.validate()) {
					out << "valid" << std::endl;
				}
				else {
					out << "invalid" << std::endl;
				}
				if(text.set()) out << "Text:" << text.value() << std::endl;
				if(textarea.set()) out << "Textarea:" << textarea.value() << std::endl;
				if(integer.set()) out << "Int:" << integer.value() << std::endl;
				if(real.set()) out << "Double:" << real.value() << std::endl;
				if(p1.set()) out << "p1:" << p1.value() << std::endl;
				if(p2.set()) out << "p2:" << p2.value() << std::endl;
				if(regex.set()) out << "regex: " << regex.value() << std::endl;
				if(email.set()) out << "email: " << email.value() << std::endl;
				if(checkbox.set()) out << "checkbox: " << checkbox.value() << std::endl;
				if(select_multiple.set()) {
					out << "selected m:";
					std::vector<bool> v=select_multiple.selected_map();
					for(unsigned i=0;i<v.size();i++)
						out << i << " ";
					out << std::endl;
					std::set<std::string> ids=select_multiple.selected_ids();
					out << "selected m ids:";
					for(std::set<std::string>::const_iterator p=ids.begin();p!=ids.end();++p)
						out << *p << " ";
					out<< std::endl;
				}
				if(select.set()) 
					out << "Select: selected " << select.selected() << " id=" << select.selected_id() << std::endl;
				if(radio.set()) 
					out << "Radio: selected " << radio.selected() << " id=" << radio.selected_id() << std::endl;
				if(submit.set())
					out << "Submit pressed: " << submit.value() << std::endl;

			} 
			else if(a_case !="/sub") {
				std::ostream &out = response().out();
				out << "non loaded<br>\n";
				cppcms::form_context context(out);
				out << "<form action=\"" << request().script_name() + request().path_info() <<  "\" method=\"post\" >\n";
				X.render(context);
				out << "</form>\n";
			}
			else { // if (a_case=="/sub")
				cppcms::form_context context(response().out());
				b.render(context);
			}


		}
		else if(a_case == "/text") {
			X.add(text);
			text.limits(2,5);
			load(X);
			if(text.set()) {
				response().out() << text.value();
			}

		}
		else if(a_case == "/number") {
			X.add(real);
			real.range(5,100);
			load(X);
			if(real.set()) {
				response().out() << real.value();
			}

		}
		else if(a_case == "/pass") {
			X.add(p1);
			X.add(p2);
			p1.non_empty();
			p2.check_equal(p1);
			load(X);
		}
		else if(a_case == "/checkbox") {
			X.add(checkbox);
			load(X);
			response().out() << checkbox.value();
		}
		else if(a_case == "/sm") {
			X.add(select_multiple);
			select_multiple.non_empty();
			select_multiple.at_most(2);
			load(X);
			std::ostream &out = response().out();
			std::vector<bool> v=select_multiple.selected_map();
			for(unsigned i=0;i<v.size();i++)
				out << v[i] << " ";
			out << std::endl;
			std::set<std::string> ids=select_multiple.selected_ids();
			for(std::set<std::string>::const_iterator p=ids.begin();p!=ids.end();++p)
				out << *p << " ";
			out<< std::endl;
		}
		else if(a_case == "/select") {
			X.add(select);
			select.non_empty();
			load(X);
			response().out() << select.selected() <<" " << select.selected_id();
		}
		else if(a_case == "/radio") {
			X.add(radio);
			radio.non_empty();
			load(X);
			response().out() << radio.selected() <<" " << radio.selected_id();
		}
		else if(a_case == "/submit") {
			X.add(submit);
			load(X);
			response().out() << submit.value();
		}
		else if(a_case == "/submitl") {
			cppcms::widgets::submit s;
			s.id("submit_id");
			s.name("submit_name");
			s.help(cppcms::locale::translate("help"));
			s.error_message(cppcms::locale::translate("error"));
			s.message(cppcms::locale::translate("message"));
			s.valid(false);
			s.value(cppcms::locale::translate("test"));
			X.add(s);
			cppcms::form_context context(response().out());
			X.render(context);
		}
		else if(a_case == "/upload" || a_case== "/upload_regex" ) {
			file.non_empty();
			file.name("file");
			file.limits(0,20);
			if(a_case=="/upload")
				file.mime("text/plain");
			else
				file.mime(booster::regex("^text/(html|plain)$"));
			file.add_valid_magic("foo");
			file.add_valid_magic("P3");
			X.add(file);
			load(X);
		}
	}